

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  mbedtls_md_info_t *pmVar3;
  md_name_entry *pmVar4;
  md_name_entry *pmVar5;
  
  if (md_name != (char *)0x0) {
    pmVar5 = md_names;
    while ((pmVar4 = md_names + 2, pmVar5->md_name != (char *)0x0 &&
           (iVar1 = strcmp(pmVar5->md_name,md_name), pmVar4 = pmVar5, iVar1 != 0))) {
      pmVar5 = pmVar5 + 1;
    }
    pmVar3 = (mbedtls_md_info_t *)0x0;
    if (pmVar4->md_type == MBEDTLS_MD_SHA256) {
      pmVar3 = &mbedtls_sha256_info;
    }
    pmVar2 = &mbedtls_sha224_info;
    if (pmVar4->md_type != MBEDTLS_MD_SHA224) {
      pmVar2 = pmVar3;
    }
    return pmVar2;
  }
  return (mbedtls_md_info_t *)0x0;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string(const char *md_name)
{
    if (NULL == md_name) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_name != NULL &&
           strcmp(entry->md_name, md_name) != 0) {
        ++entry;
    }

    return mbedtls_md_info_from_type(entry->md_type);
}